

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifrso(bifcxdef *ctx,int argc)

{
  long lVar1;
  int iVar2;
  long in_RDI;
  voccxdef *vctx;
  int err;
  char buf [4096];
  uchar *fn;
  int in_stack_ffffffffffffefbc;
  runcxdef *in_stack_ffffffffffffefc0;
  char *in_stack_ffffffffffffefc8;
  runcxdef *in_stack_ffffffffffffefd0;
  uchar *str;
  undefined4 in_stack_ffffffffffffefe0;
  undefined4 in_stack_ffffffffffffefe4;
  char *in_stack_ffffffffffffefe8;
  bifcxdef *in_stack_ffffffffffffeff0;
  char *in_stack_fffffffffffff0e0;
  voccxdef *in_stack_fffffffffffff0e8;
  
  str = *(uchar **)(*(long *)(in_RDI + 8) + 0x70);
  if (*(char *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10) == '\x05') {
    iVar2 = os_paramfile(&stack0xffffffffffffefe8);
    if (iVar2 == 0) {
      runpnum(in_stack_ffffffffffffefd0,(long)in_stack_ffffffffffffefc8);
      return;
    }
  }
  else {
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x03') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc);
    }
    in_stack_ffffffffffffefd0 = *(runcxdef **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    bifcstr(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8,
            CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0),str);
    in_stack_ffffffffffffefc8 = &stack0xffffffffffffefe8;
    os_defext((char *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
  }
  fiorso(in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
  objulose(*(objucxdef **)(str + 0x20));
  runpnum(in_stack_ffffffffffffefd0,(long)in_stack_ffffffffffffefc8);
  str[0x119a] = str[0x119a] | 1;
  return;
}

Assistant:

void bifrso(bifcxdef *ctx, int argc)
{
    uchar    *fn;
    char      buf[OSFNMAX];
    int       err;
    voccxdef *vctx = ctx->bifcxrun->runcxvoc;
    
    bifcntargs(ctx, 1, argc);
    
    /* check for special restore(nil) - restore game given as parameter */
    if (runtostyp(ctx->bifcxrun) == DAT_NIL)
    {
        /* get filename from startup parameter, if any */
        if (!os_paramfile(buf))
        {
            /* no startup parameter */
            runpnum(ctx->bifcxrun, FIORSO_NO_PARAM_FILE);
            return;
        }
    }
    else
    {
        /* get string parameter - it's the filename */
        fn = runpopstr(ctx->bifcxrun);
        bifcstr(ctx, buf, (size_t)sizeof(buf), fn);
        os_defext(buf, ctx->bifcxsavext != 0 ? ctx->bifcxsavext : "sav");
    }

    /* try restoring the file */
    err = fiorso(vctx, buf);

    /* blow away all undo records */
    objulose(vctx->voccxundo);

    /* return the result code from fiorso */
    runpnum(ctx->bifcxrun, err);

    /* note that the rest of the command line is to be ignored */
    vctx->voccxflg |= VOCCXFCLEAR;
}